

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O0

double __thiscall Geodesic::getDist(Geodesic *this)

{
  bool bVar1;
  reference this_00;
  long in_RDI;
  __type _Var2;
  double dVar3;
  PhyloTreeEdge *commonEdge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  double commonEdgeDistSquared;
  RatioSequence *in_stack_000000e8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff78;
  int __y;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *in_stack_ffffffffffffff80;
  RatioSequence *in_stack_ffffffffffffffa0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_20;
  long local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = in_RDI + 0x20;
  local_20._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffff78);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
              ::operator*(&local_20);
    PhyloTreeEdge::getLength(this_00);
    _Var2 = std::pow<double,int>
                      ((double)in_stack_ffffffffffffff80,
                       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    local_10 = _Var2 + local_10;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_20);
  }
  RatioSequence::getNonDesRSWithMinDist(in_stack_000000e8);
  __y = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  RatioSequence::getDistance(in_stack_ffffffffffffffa0);
  _Var2 = std::pow<double,int>((double)in_stack_ffffffffffffff80,__y);
  dVar3 = sqrt(_Var2 + local_10 + *(double *)(in_RDI + 0x38));
  RatioSequence::~RatioSequence((RatioSequence *)0x1cddd4);
  return dVar3;
}

Assistant:

double Geodesic::getDist() {
    double commonEdgeDistSquared = 0;
    for (auto & commonEdge : commonEdges) {
        commonEdgeDistSquared += pow(commonEdge.getLength(), 2);
    }
    return sqrt(pow(rs.getNonDesRSWithMinDist().getDistance(), 2) + commonEdgeDistSquared + leafContributionSquared);
}